

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetStopTime(void *ida_mem,sunrealtype tstop)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x16b,"IDASetStopTime",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    if ((0 < *(long *)((long)ida_mem + 0x5b8)) &&
       ((tstop - *(double *)((long)ida_mem + 0x4f8)) * *(double *)((long)ida_mem + 0x4e0) < 0.0)) {
      IDAProcessError((IDAMem)ida_mem,-0x16,0x179,"IDASetStopTime",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                      ,
                      "The value tstop = %.15g is behind current t = %.15gin the direction of integration."
                     );
      return -0x16;
    }
    *(sunrealtype *)((long)ida_mem + 0x4b0) = tstop;
    *(undefined4 *)((long)ida_mem + 0x4a8) = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDASetStopTime(void* ida_mem, sunrealtype tstop)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  /* If IDASolve was called at least once, test if tstop is legal
   * (i.e. if it was not already passed).
   * If IDASetStopTime is called before the first call to IDASolve,
   * tstop will be checked in IDASolve. */
  if (IDA_mem->ida_nst > 0)
  {
    if ((tstop - IDA_mem->ida_tn) * IDA_mem->ida_hh < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_TSTOP, tstop, IDA_mem->ida_tn);
      return (IDA_ILL_INPUT);
    }
  }

  IDA_mem->ida_tstop    = tstop;
  IDA_mem->ida_tstopset = SUNTRUE;

  return (IDA_SUCCESS);
}